

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void test_uint32_iterator(_Bool run)

{
  _Bool _Var1;
  roaring_bitmap_t *r;
  roaring_uint32_iterator_t *it;
  uint32_t i_2;
  uint uVar2;
  uint32_t i;
  uint32_t uVar3;
  bool bVar4;
  char *internal_reason_buf;
  char *local_38;
  
  r = roaring_bitmap_create_with_capacity(0);
  uVar3 = 0xfffffffd;
  do {
    uVar3 = uVar3 + 3;
    roaring_bitmap_add(r,uVar3);
  } while (uVar3 < 0x101cd);
  uVar3 = 100000;
  do {
    roaring_bitmap_add(r,uVar3);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 200000);
  uVar3 = 0x4937c;
  do {
    uVar3 = uVar3 + 100;
    roaring_bitmap_add(r,uVar3);
  } while (uVar3 < 0x7a0bc);
  uVar3 = 600000;
  do {
    roaring_bitmap_add(r,uVar3);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 700000);
  uVar3 = 0xc34f9;
  do {
    uVar3 = uVar3 + 7;
    roaring_bitmap_add(r,uVar3);
  } while (uVar3 < 0xdbb99);
  if (run) {
    roaring_bitmap_run_optimize(r);
  }
  local_38 = (char *)0x0;
  _Var1 = roaring_bitmap_internal_validate(r,&local_38);
  if (!_Var1) {
    print_error("ERROR: internal validation failed: %s\n",local_38);
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
          ,0x39e);
  }
  it = roaring_iterator_create(r);
  uVar3 = 0xfffffffd;
  do {
    uVar3 = uVar3 + 3;
    _assert_true((ulong)it->has_value,"iter->has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3a1);
    _assert_true((ulong)(uVar3 == it->current_value),"iter->current_value == i",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3a2);
    roaring_uint32_iterator_move_equalorlarger(it,uVar3);
    _assert_true((ulong)it->has_value,"iter->has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3a4);
    _assert_true((ulong)(uVar3 == it->current_value),"iter->current_value == i",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3a5);
    roaring_uint32_iterator_advance(it);
  } while (uVar3 < 0x101cd);
  uVar3 = 100000;
  do {
    _assert_true((ulong)it->has_value,"iter->has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3a9);
    _assert_true((ulong)(uVar3 == it->current_value),"iter->current_value == i",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3aa);
    roaring_uint32_iterator_move_equalorlarger(it,uVar3);
    _assert_true((ulong)it->has_value,"iter->has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3ac);
    _assert_true((ulong)(uVar3 == it->current_value),"iter->current_value == i",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3ad);
    roaring_uint32_iterator_advance(it);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 200000);
  uVar3 = 0x4937c;
  do {
    uVar3 = uVar3 + 100;
    _assert_true((ulong)it->has_value,"iter->has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3b1);
    _assert_true((ulong)(uVar3 == it->current_value),"iter->current_value == i",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3b2);
    roaring_uint32_iterator_move_equalorlarger(it,uVar3);
    _assert_true((ulong)it->has_value,"iter->has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3b4);
    _assert_true((ulong)(uVar3 == it->current_value),"iter->current_value == i",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3b5);
    roaring_uint32_iterator_advance(it);
  } while (uVar3 < 0x7a0bc);
  uVar3 = 600000;
  do {
    _assert_true((ulong)it->has_value,"iter->has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3b9);
    _assert_true((ulong)(uVar3 == it->current_value),"iter->current_value == i",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3ba);
    roaring_uint32_iterator_move_equalorlarger(it,uVar3);
    _assert_true((ulong)it->has_value,"iter->has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3bc);
    _assert_true((ulong)(uVar3 == it->current_value),"iter->current_value == i",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3bd);
    roaring_uint32_iterator_advance(it);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 700000);
  uVar3 = 0xc34f9;
  do {
    uVar3 = uVar3 + 7;
    _assert_true((ulong)it->has_value,"iter->has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3c1);
    _assert_true((ulong)(uVar3 == it->current_value),"iter->current_value == i",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3c2);
    roaring_uint32_iterator_move_equalorlarger(it,uVar3);
    _assert_true((ulong)it->has_value,"iter->has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3c4);
    _assert_true((ulong)(uVar3 == it->current_value),"iter->current_value == i",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3c5);
    roaring_uint32_iterator_advance(it);
  } while (uVar3 < 0xdbb99);
  _assert_true((ulong)it->has_value ^ 1,"iter->has_value",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3c8);
  roaring_uint32_iterator_move_equalorlarger(it,0);
  _assert_true((ulong)it->has_value,"iter->has_value",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3ca);
  _assert_true((ulong)(it->current_value == 0),"iter->current_value == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3cb);
  roaring_uint32_iterator_move_equalorlarger(it,66000);
  _assert_true((ulong)it->has_value,"iter->has_value",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3cd);
  _assert_true((ulong)(it->current_value == 100000),"iter->current_value == 100000",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3ce);
  roaring_uint32_iterator_move_equalorlarger(it,100000);
  _assert_true((ulong)it->has_value,"iter->has_value",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3d0);
  _assert_true((ulong)(it->current_value == 100000),"iter->current_value == 100000",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3d1);
  roaring_uint32_iterator_move_equalorlarger(it,200000);
  _assert_true((ulong)it->has_value,"iter->has_value",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3d3);
  _assert_true((ulong)(it->current_value == 300000),"iter->current_value == 300000",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3d4);
  roaring_uint32_iterator_move_equalorlarger(it,300000);
  _assert_true((ulong)it->has_value,"iter->has_value",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3d6);
  _assert_true((ulong)(it->current_value == 300000),"iter->current_value == 300000",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3d7);
  roaring_uint32_iterator_move_equalorlarger(it,500000);
  _assert_true((ulong)it->has_value,"iter->has_value",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3d9);
  _assert_true((ulong)(it->current_value == 600000),"iter->current_value == 600000",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3da);
  roaring_uint32_iterator_move_equalorlarger(it,600000);
  _assert_true((ulong)it->has_value,"iter->has_value",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3dc);
  _assert_true((ulong)(it->current_value == 600000),"iter->current_value == 600000",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3dd);
  roaring_uint32_iterator_move_equalorlarger(it,700000);
  _assert_true((ulong)it->has_value,"iter->has_value",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3df);
  _assert_true((ulong)(it->current_value == 800000),"iter->current_value == 800000",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3e0);
  roaring_uint32_iterator_move_equalorlarger(it,800000);
  _assert_true((ulong)it->has_value,"iter->has_value",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3e2);
  _assert_true((ulong)(it->current_value == 800000),"iter->current_value == 800000",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3e3);
  roaring_uint32_iterator_move_equalorlarger(it,900000);
  _assert_true((ulong)it->has_value ^ 1,"iter->has_value",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x3e5);
  roaring_uint32_iterator_move_equalorlarger(it,0);
  uVar2 = 0;
  do {
    _assert_true((ulong)it->has_value,"iter->has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,1000);
    _assert_true((ulong)(uVar2 == it->current_value),"iter->current_value == i",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3e9);
    roaring_uint32_iterator_move_equalorlarger(it,uVar2 + 1);
    bVar4 = uVar2 < 0x101cd;
    uVar2 = uVar2 + 3;
  } while (bVar4);
  uVar3 = 0x186a1;
  do {
    _assert_true((ulong)it->has_value,"iter->has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3ed);
    _assert_true((ulong)(uVar3 - 1 == it->current_value),"iter->current_value == i",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3ee);
    roaring_uint32_iterator_move_equalorlarger(it,uVar3);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x30d41);
  uVar2 = 300000;
  do {
    _assert_true((ulong)it->has_value,"iter->has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3f2);
    _assert_true((ulong)(uVar2 == it->current_value),"iter->current_value == i",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3f3);
    roaring_uint32_iterator_move_equalorlarger(it,uVar2 + 1);
    bVar4 = uVar2 < 0x7a0bc;
    uVar2 = uVar2 + 100;
  } while (bVar4);
  uVar3 = 600000;
  do {
    _assert_true((ulong)it->has_value,"iter->has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3f7);
    _assert_true((ulong)(uVar3 == it->current_value),"iter->current_value == i",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3f8);
    uVar3 = uVar3 + 1;
    roaring_uint32_iterator_move_equalorlarger(it,uVar3);
  } while (uVar3 != 700000);
  uVar2 = 800000;
  do {
    _assert_true((ulong)it->has_value,"iter->has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3fc);
    _assert_true((ulong)(uVar2 == it->current_value),"iter->current_value == i",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x3fd);
    roaring_uint32_iterator_move_equalorlarger(it,uVar2 + 1);
    bVar4 = uVar2 < 0xdbb99;
    uVar2 = uVar2 + 7;
  } while (bVar4);
  _assert_true((ulong)it->has_value ^ 1,"iter->has_value",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x400);
  roaring_uint32_iterator_free(it);
  roaring_bitmap_free(r);
  return;
}

Assistant:

void test_uint32_iterator(bool run) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    for (uint32_t i = 0; i < 66000; i += 3) {
        roaring_bitmap_add(r1, i);
    }
    for (uint32_t i = 100000; i < 200000; i++) {
        roaring_bitmap_add(r1, i);
    }
    for (uint32_t i = 300000; i < 500000; i += 100) {
        roaring_bitmap_add(r1, i);
    }
    for (uint32_t i = 600000; i < 700000; i += 1) {
        roaring_bitmap_add(r1, i);
    }
    for (uint32_t i = 800000; i < 900000; i += 7) {
        roaring_bitmap_add(r1, i);
    }
    if (run) roaring_bitmap_run_optimize(r1);
    assert_bitmap_validate(r1);
    roaring_uint32_iterator_t *iter = roaring_iterator_create(r1);
    for (uint32_t i = 0; i < 66000; i += 3) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i);
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_advance(iter);
    }
    for (uint32_t i = 100000; i < 200000; i++) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i);
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_advance(iter);
    }
    for (uint32_t i = 300000; i < 500000; i += 100) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i);
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_advance(iter);
    }
    for (uint32_t i = 600000; i < 700000; i += 1) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i);
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_advance(iter);
    }
    for (uint32_t i = 800000; i < 900000; i += 7) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i);
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_advance(iter);
    }
    assert_false(iter->has_value);
    roaring_uint32_iterator_move_equalorlarger(iter, 0);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 0);
    roaring_uint32_iterator_move_equalorlarger(iter, 66000);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 100000);
    roaring_uint32_iterator_move_equalorlarger(iter, 100000);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 100000);
    roaring_uint32_iterator_move_equalorlarger(iter, 200000);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 300000);
    roaring_uint32_iterator_move_equalorlarger(iter, 300000);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 300000);
    roaring_uint32_iterator_move_equalorlarger(iter, 500000);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 600000);
    roaring_uint32_iterator_move_equalorlarger(iter, 600000);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 600000);
    roaring_uint32_iterator_move_equalorlarger(iter, 700000);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 800000);
    roaring_uint32_iterator_move_equalorlarger(iter, 800000);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 800000);
    roaring_uint32_iterator_move_equalorlarger(iter, 900000);
    assert_false(iter->has_value);
    roaring_uint32_iterator_move_equalorlarger(iter, 0);
    for (uint32_t i = 0; i < 66000; i += 3) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i + 1);
    }
    for (uint32_t i = 100000; i < 200000; i++) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i + 1);
    }
    for (uint32_t i = 300000; i < 500000; i += 100) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i + 1);
    }
    for (uint32_t i = 600000; i < 700000; i += 1) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i + 1);
    }
    for (uint32_t i = 800000; i < 900000; i += 7) {
        assert_true(iter->has_value);
        assert_true(iter->current_value == i);
        roaring_uint32_iterator_move_equalorlarger(iter, i + 1);
    }
    assert_false(iter->has_value);

    roaring_uint32_iterator_free(iter);
    roaring_bitmap_free(r1);
}